

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void markold(global_State *g,GCObject *from,GCObject *to)

{
  GCObject *local_28;
  GCObject *p;
  GCObject *to_local;
  GCObject *from_local;
  global_State *g_local;
  
  for (local_28 = from; local_28 != to; local_28 = local_28->next) {
    if (((local_28->marked & 7) == 3) &&
       (local_28->marked = local_28->marked ^ 7, (local_28->marked & 0x20) != 0)) {
      reallymarkobject(g,local_28);
    }
  }
  return;
}

Assistant:

static void markold (global_State *g, GCObject *from, GCObject *to) {
  GCObject *p;
  for (p = from; p != to; p = p->next) {
    if (getage(p) == G_OLD1) {
      lua_assert(!iswhite(p));
      changeage(p, G_OLD1, G_OLD);  /* now they are old */
      if (isblack(p))
        reallymarkobject(g, p);
    }
  }
}